

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# types.h
# Opt level: O1

int mpt::type_properties<mpt::span<const_mpt::reference<mpt::metatype>_>_>::id(bool obtain)

{
  int iVar1;
  type_traits *ptVar2;
  
  iVar1 = -3;
  if (0 < id::_valtype) {
    iVar1 = id::_valtype;
  }
  if (id::_valtype < 1 && obtain) {
    ptVar2 = _dynamic_traits();
    id::_valtype = mpt::type_traits::add(ptVar2);
    iVar1 = id::_valtype;
  }
  return iVar1;
}

Assistant:

static int id(bool obtain = false) {
		static int _valtype = 0;
		if (_valtype > 0) {
			return _valtype;
		}
		/* use vector IDs for builtin types */
		int type = type_properties<T>::id(false);
		if ((type = MPT_type_toVector(type)) > 0) {
			return _valtype = type;
		}
		if (!obtain) {
			return BadType;
		}
		return _valtype = type_traits::add(*_dynamic_traits());
	}